

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::ModuleBase::ModuleBase
          (ModuleBase *this,ObjectType ot,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  SourceCodeText *pSVar1;
  
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__ASTObject_00301658;
  (this->super_ASTObject).objectType = ot;
  pSVar1 = (processorName->location).sourceCode.object;
  (this->super_ASTObject).context.location.sourceCode.object = pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->super_ASTObject).context.location.location.data = (processorName->location).location.data;
  (this->super_ASTObject).context.parentScope = processorName->parentScope;
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__ModuleBase_003014f0;
  (this->super_Scope)._vptr_Scope = (_func_int **)&PTR__ModuleBase_003015a0;
  (this->processorKeywordLocation).sourceCode.object = (processorKeyword->sourceCode).object;
  (processorKeyword->sourceCode).object = (SourceCodeText *)0x0;
  (this->processorKeywordLocation).location.data = (processorKeyword->location).data;
  (this->name).name = moduleName.name;
  this->isFullyResolved = false;
  memset(&this->specialisationParams,0,0xa0);
  return;
}

Assistant:

ASTObject (ObjectType ot, const Context& c) : objectType (ot), context (c) {}